

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_hash_map.h
# Opt level: O0

void __thiscall
crnlib::
hash_map<unsigned_long_long,_unsigned_int,_crnlib::hasher<unsigned_long_long>,_crnlib::equal_to<unsigned_long_long>_>
::~hash_map(hash_map<unsigned_long_long,_unsigned_int,_crnlib::hasher<unsigned_long_long>,_crnlib::equal_to<unsigned_long_long>_>
            *this)

{
  hash_map<unsigned_long_long,_unsigned_int,_crnlib::hasher<unsigned_long_long>,_crnlib::equal_to<unsigned_long_long>_>
  *this_local;
  
  clear(this);
  vector<crnlib::hash_map<unsigned_long_long,_unsigned_int,_crnlib::hasher<unsigned_long_long>,_crnlib::equal_to<unsigned_long_long>_>::raw_node>
  ::~vector(&this->m_values);
  return;
}

Assistant:

inline ~hash_map()
        {
            clear();
        }